

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subscription_status_test.cpp
# Opt level: O0

void __thiscall
bidfx_public_api::SubscriptonStatusTest_test_to_string_Test::TestBody
          (SubscriptonStatusTest_test_to_string_Test *this)

{
  bool bVar1;
  mapped_type *pmVar2;
  char *pcVar3;
  AssertHelper local_200;
  Message local_1f8;
  key_type local_1ec;
  undefined1 local_1e8 [8];
  AssertionResult gtest_ar_11;
  Message local_1d0;
  key_type local_1c4;
  undefined1 local_1c0 [8];
  AssertionResult gtest_ar_10;
  Message local_1a8;
  key_type local_19c;
  undefined1 local_198 [8];
  AssertionResult gtest_ar_9;
  Message local_180;
  key_type local_174;
  undefined1 local_170 [8];
  AssertionResult gtest_ar_8;
  Message local_158;
  key_type local_14c;
  undefined1 local_148 [8];
  AssertionResult gtest_ar_7;
  Message local_130;
  key_type local_124;
  undefined1 local_120 [8];
  AssertionResult gtest_ar_6;
  Message local_108;
  key_type local_fc;
  undefined1 local_f8 [8];
  AssertionResult gtest_ar_5;
  Message local_e0;
  key_type local_d4;
  undefined1 local_d0 [8];
  AssertionResult gtest_ar_4;
  Message local_b8;
  key_type local_ac;
  undefined1 local_a8 [8];
  AssertionResult gtest_ar_3;
  Message local_90;
  key_type local_84;
  undefined1 local_80 [8];
  AssertionResult gtest_ar_2;
  Message local_68;
  key_type local_5c;
  undefined1 local_58 [8];
  AssertionResult gtest_ar_1;
  Message local_40 [3];
  key_type local_24;
  undefined1 local_20 [8];
  AssertionResult gtest_ar;
  SubscriptonStatusTest_test_to_string_Test *this_local;
  
  local_24 = UNAVAILABLE;
  gtest_ar.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this
  ;
  pmVar2 = std::
           map<bidfx_public_api::SubscriptionStatus,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<bidfx_public_api::SubscriptionStatus>,_std::allocator<std::pair<const_bidfx_public_api::SubscriptionStatus,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<bidfx_public_api::SubscriptionStatus,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<bidfx_public_api::SubscriptionStatus>,_std::allocator<std::pair<const_bidfx_public_api::SubscriptionStatus,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)subscription_status_map_abi_cxx11_,&local_24);
  testing::internal::EqHelper<false>::Compare<char[12],std::__cxx11::string>
            ((EqHelper<false> *)local_20,"\"UNAVAILABLE\"",
             "subscription_status_map[SubscriptionStatus::UNAVAILABLE]",(char (*) [12])"UNAVAILABLE"
             ,pmVar2);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_20);
  if (!bVar1) {
    testing::Message::Message(local_40);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_20);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/subscription_status_test.cpp"
               ,0x1a,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,local_40);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(local_40);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_20);
  local_5c = CLOSED;
  pmVar2 = std::
           map<bidfx_public_api::SubscriptionStatus,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<bidfx_public_api::SubscriptionStatus>,_std::allocator<std::pair<const_bidfx_public_api::SubscriptionStatus,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<bidfx_public_api::SubscriptionStatus,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<bidfx_public_api::SubscriptionStatus>,_std::allocator<std::pair<const_bidfx_public_api::SubscriptionStatus,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)subscription_status_map_abi_cxx11_,&local_5c);
  testing::internal::EqHelper<false>::Compare<char[7],std::__cxx11::string>
            ((EqHelper<false> *)local_58,"\"CLOSED\"",
             "subscription_status_map[SubscriptionStatus::CLOSED]",(char (*) [7])"CLOSED",pmVar2);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_58);
  if (!bVar1) {
    testing::Message::Message(&local_68);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_58);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/subscription_status_test.cpp"
               ,0x1b,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_68);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_68);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_58);
  local_84 = CANCELLED;
  pmVar2 = std::
           map<bidfx_public_api::SubscriptionStatus,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<bidfx_public_api::SubscriptionStatus>,_std::allocator<std::pair<const_bidfx_public_api::SubscriptionStatus,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<bidfx_public_api::SubscriptionStatus,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<bidfx_public_api::SubscriptionStatus>,_std::allocator<std::pair<const_bidfx_public_api::SubscriptionStatus,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)subscription_status_map_abi_cxx11_,&local_84);
  testing::internal::EqHelper<false>::Compare<char[10],std::__cxx11::string>
            ((EqHelper<false> *)local_80,"\"CANCELLED\"",
             "subscription_status_map[SubscriptionStatus::CANCELLED]",(char (*) [10])"CANCELLED",
             pmVar2);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_80);
  if (!bVar1) {
    testing::Message::Message(&local_90);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_80);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/subscription_status_test.cpp"
               ,0x1c,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_90);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
    testing::Message::~Message(&local_90);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_80);
  local_ac = DISCONTINUED;
  pmVar2 = std::
           map<bidfx_public_api::SubscriptionStatus,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<bidfx_public_api::SubscriptionStatus>,_std::allocator<std::pair<const_bidfx_public_api::SubscriptionStatus,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<bidfx_public_api::SubscriptionStatus,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<bidfx_public_api::SubscriptionStatus>,_std::allocator<std::pair<const_bidfx_public_api::SubscriptionStatus,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)subscription_status_map_abi_cxx11_,&local_ac);
  testing::internal::EqHelper<false>::Compare<char[13],std::__cxx11::string>
            ((EqHelper<false> *)local_a8,"\"DISCONTINUED\"",
             "subscription_status_map[SubscriptionStatus::DISCONTINUED]",
             (char (*) [13])"DISCONTINUED",pmVar2);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_a8);
  if (!bVar1) {
    testing::Message::Message(&local_b8);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_a8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_4.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/subscription_status_test.cpp"
               ,0x1d,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_4.message_,&local_b8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4.message_);
    testing::Message::~Message(&local_b8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_a8);
  local_d4 = EXHAUSTED;
  pmVar2 = std::
           map<bidfx_public_api::SubscriptionStatus,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<bidfx_public_api::SubscriptionStatus>,_std::allocator<std::pair<const_bidfx_public_api::SubscriptionStatus,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<bidfx_public_api::SubscriptionStatus,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<bidfx_public_api::SubscriptionStatus>,_std::allocator<std::pair<const_bidfx_public_api::SubscriptionStatus,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)subscription_status_map_abi_cxx11_,&local_d4);
  testing::internal::EqHelper<false>::Compare<char[10],std::__cxx11::string>
            ((EqHelper<false> *)local_d0,"\"EXHAUSTED\"",
             "subscription_status_map[SubscriptionStatus::EXHAUSTED]",(char (*) [10])"EXHAUSTED",
             pmVar2);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_d0);
  if (!bVar1) {
    testing::Message::Message(&local_e0);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_d0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_5.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/subscription_status_test.cpp"
               ,0x1e,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_5.message_,&local_e0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_5.message_);
    testing::Message::~Message(&local_e0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_d0);
  local_fc = INACTIVE;
  pmVar2 = std::
           map<bidfx_public_api::SubscriptionStatus,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<bidfx_public_api::SubscriptionStatus>,_std::allocator<std::pair<const_bidfx_public_api::SubscriptionStatus,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<bidfx_public_api::SubscriptionStatus,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<bidfx_public_api::SubscriptionStatus>,_std::allocator<std::pair<const_bidfx_public_api::SubscriptionStatus,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)subscription_status_map_abi_cxx11_,&local_fc);
  testing::internal::EqHelper<false>::Compare<char[9],std::__cxx11::string>
            ((EqHelper<false> *)local_f8,"\"INACTIVE\"",
             "subscription_status_map[SubscriptionStatus::INACTIVE]",(char (*) [9])"INACTIVE",pmVar2
            );
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_f8);
  if (!bVar1) {
    testing::Message::Message(&local_108);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_f8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_6.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/subscription_status_test.cpp"
               ,0x1f,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_6.message_,&local_108);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_6.message_);
    testing::Message::~Message(&local_108);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_f8);
  local_124 = OK;
  pmVar2 = std::
           map<bidfx_public_api::SubscriptionStatus,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<bidfx_public_api::SubscriptionStatus>,_std::allocator<std::pair<const_bidfx_public_api::SubscriptionStatus,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<bidfx_public_api::SubscriptionStatus,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<bidfx_public_api::SubscriptionStatus>,_std::allocator<std::pair<const_bidfx_public_api::SubscriptionStatus,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)subscription_status_map_abi_cxx11_,&local_124);
  testing::internal::EqHelper<false>::Compare<char[3],std::__cxx11::string>
            ((EqHelper<false> *)local_120,"\"OK\"","subscription_status_map[SubscriptionStatus::OK]"
             ,(char (*) [3])0x31fe94,pmVar2);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_120);
  if (!bVar1) {
    testing::Message::Message(&local_130);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_120);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_7.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/subscription_status_test.cpp"
               ,0x20,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_7.message_,&local_130);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_7.message_);
    testing::Message::~Message(&local_130);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_120);
  local_14c = PENDING;
  pmVar2 = std::
           map<bidfx_public_api::SubscriptionStatus,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<bidfx_public_api::SubscriptionStatus>,_std::allocator<std::pair<const_bidfx_public_api::SubscriptionStatus,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<bidfx_public_api::SubscriptionStatus,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<bidfx_public_api::SubscriptionStatus>,_std::allocator<std::pair<const_bidfx_public_api::SubscriptionStatus,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)subscription_status_map_abi_cxx11_,&local_14c);
  testing::internal::EqHelper<false>::Compare<char[8],std::__cxx11::string>
            ((EqHelper<false> *)local_148,"\"PENDING\"",
             "subscription_status_map[SubscriptionStatus::PENDING]",(char (*) [8])"PENDING",pmVar2);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_148);
  if (!bVar1) {
    testing::Message::Message(&local_158);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_148);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_8.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/subscription_status_test.cpp"
               ,0x21,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_8.message_,&local_158);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_8.message_);
    testing::Message::~Message(&local_158);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_148);
  local_174 = PROHIBITED;
  pmVar2 = std::
           map<bidfx_public_api::SubscriptionStatus,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<bidfx_public_api::SubscriptionStatus>,_std::allocator<std::pair<const_bidfx_public_api::SubscriptionStatus,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<bidfx_public_api::SubscriptionStatus,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<bidfx_public_api::SubscriptionStatus>,_std::allocator<std::pair<const_bidfx_public_api::SubscriptionStatus,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)subscription_status_map_abi_cxx11_,&local_174);
  testing::internal::EqHelper<false>::Compare<char[11],std::__cxx11::string>
            ((EqHelper<false> *)local_170,"\"PROHIBITED\"",
             "subscription_status_map[SubscriptionStatus::PROHIBITED]",(char (*) [11])"PROHIBITED",
             pmVar2);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_170);
  if (!bVar1) {
    testing::Message::Message(&local_180);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_170);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_9.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/subscription_status_test.cpp"
               ,0x22,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_9.message_,&local_180);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_9.message_);
    testing::Message::~Message(&local_180);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_170);
  local_19c = REJECTED;
  pmVar2 = std::
           map<bidfx_public_api::SubscriptionStatus,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<bidfx_public_api::SubscriptionStatus>,_std::allocator<std::pair<const_bidfx_public_api::SubscriptionStatus,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<bidfx_public_api::SubscriptionStatus,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<bidfx_public_api::SubscriptionStatus>,_std::allocator<std::pair<const_bidfx_public_api::SubscriptionStatus,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)subscription_status_map_abi_cxx11_,&local_19c);
  testing::internal::EqHelper<false>::Compare<char[9],std::__cxx11::string>
            ((EqHelper<false> *)local_198,"\"REJECTED\"",
             "subscription_status_map[SubscriptionStatus::REJECTED]",(char (*) [9])"REJECTED",pmVar2
            );
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_198);
  if (!bVar1) {
    testing::Message::Message(&local_1a8);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_198);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_10.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/subscription_status_test.cpp"
               ,0x23,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_10.message_,&local_1a8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_10.message_);
    testing::Message::~Message(&local_1a8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_198);
  local_1c4 = STALE;
  pmVar2 = std::
           map<bidfx_public_api::SubscriptionStatus,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<bidfx_public_api::SubscriptionStatus>,_std::allocator<std::pair<const_bidfx_public_api::SubscriptionStatus,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<bidfx_public_api::SubscriptionStatus,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<bidfx_public_api::SubscriptionStatus>,_std::allocator<std::pair<const_bidfx_public_api::SubscriptionStatus,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)subscription_status_map_abi_cxx11_,&local_1c4);
  testing::internal::EqHelper<false>::Compare<char[6],std::__cxx11::string>
            ((EqHelper<false> *)local_1c0,"\"STALE\"",
             "subscription_status_map[SubscriptionStatus::STALE]",(char (*) [6])"STALE",pmVar2);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1c0);
  if (!bVar1) {
    testing::Message::Message(&local_1d0);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_1c0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_11.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/subscription_status_test.cpp"
               ,0x24,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_11.message_,&local_1d0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_11.message_);
    testing::Message::~Message(&local_1d0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1c0);
  local_1ec = TIMEOUT;
  pmVar2 = std::
           map<bidfx_public_api::SubscriptionStatus,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<bidfx_public_api::SubscriptionStatus>,_std::allocator<std::pair<const_bidfx_public_api::SubscriptionStatus,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<bidfx_public_api::SubscriptionStatus,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<bidfx_public_api::SubscriptionStatus>,_std::allocator<std::pair<const_bidfx_public_api::SubscriptionStatus,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)subscription_status_map_abi_cxx11_,&local_1ec);
  testing::internal::EqHelper<false>::Compare<char[8],std::__cxx11::string>
            ((EqHelper<false> *)local_1e8,"\"TIMEOUT\"",
             "subscription_status_map[SubscriptionStatus::TIMEOUT]",(char (*) [8])"TIMEOUT",pmVar2);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1e8);
  if (!bVar1) {
    testing::Message::Message(&local_1f8);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_1e8);
    testing::internal::AssertHelper::AssertHelper
              (&local_200,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/subscription_status_test.cpp"
               ,0x25,pcVar3);
    testing::internal::AssertHelper::operator=(&local_200,&local_1f8);
    testing::internal::AssertHelper::~AssertHelper(&local_200);
    testing::Message::~Message(&local_1f8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1e8);
  return;
}

Assistant:

TEST(SubscriptonStatusTest, test_to_string)
{
    EXPECT_EQ("UNAVAILABLE", subscription_status_map[SubscriptionStatus::UNAVAILABLE]);
    EXPECT_EQ("CLOSED", subscription_status_map[SubscriptionStatus::CLOSED]);
    EXPECT_EQ("CANCELLED", subscription_status_map[SubscriptionStatus::CANCELLED]);
    EXPECT_EQ("DISCONTINUED", subscription_status_map[SubscriptionStatus::DISCONTINUED]);
    EXPECT_EQ("EXHAUSTED", subscription_status_map[SubscriptionStatus::EXHAUSTED]);
    EXPECT_EQ("INACTIVE", subscription_status_map[SubscriptionStatus::INACTIVE]);
    EXPECT_EQ("OK", subscription_status_map[SubscriptionStatus::OK]);
    EXPECT_EQ("PENDING", subscription_status_map[SubscriptionStatus::PENDING]);
    EXPECT_EQ("PROHIBITED", subscription_status_map[SubscriptionStatus::PROHIBITED]);
    EXPECT_EQ("REJECTED", subscription_status_map[SubscriptionStatus::REJECTED]);
    EXPECT_EQ("STALE", subscription_status_map[SubscriptionStatus::STALE]);
    EXPECT_EQ("TIMEOUT", subscription_status_map[SubscriptionStatus::TIMEOUT]);
}